

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

QRectF * __thiscall
QGraphicsViewPrivate::mapRectToScene
          (QRectF *__return_storage_ptr__,QGraphicsViewPrivate *this,QRect *rect)

{
  long in_FS_OFFSET;
  QRect QVar1;
  bool local_70 [80];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0x300 & 0x20) != 0) {
    updateScroll(this);
  }
  QVar1 = QRect::translated(rect,(int)this->scrollX,(int)this->scrollY);
  if ((this->field_0x300 & 0x10) == 0) {
    QTransform::inverted(local_70);
    QTransform::mapRect((QRectF *)__return_storage_ptr__);
  }
  else {
    __return_storage_ptr__->w = (double)(((long)QVar1.x2.m_i.m_i - (long)QVar1.x1.m_i.m_i) + 1);
    __return_storage_ptr__->h = (double)(((QVar1._8_8_ >> 0x20) - (QVar1._0_8_ >> 0x20)) + 1);
    __return_storage_ptr__->xp = (double)QVar1.x1.m_i.m_i;
    __return_storage_ptr__->yp = (double)QVar1.y1.m_i.m_i;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QRectF QGraphicsViewPrivate::mapRectToScene(const QRect &rect) const
{
    if (dirtyScroll)
        const_cast<QGraphicsViewPrivate *>(this)->updateScroll();
    QRectF scrolled = QRectF(rect.translated(scrollX, scrollY));
    return identityMatrix ? scrolled : matrix.inverted().mapRect(scrolled);
}